

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O1

void __thiscall ui::Led::FetchState(Led *this)

{
  pointer pcVar1;
  char cVar2;
  istream *piVar3;
  ulong uVar4;
  ulong uVar5;
  string trigger;
  string entry;
  stringstream ss;
  ifstream file;
  undefined1 *local_420;
  undefined8 local_418;
  undefined1 local_410;
  undefined7 uStack_40f;
  value_type local_400;
  long *local_3e0 [2];
  long local_3d0 [2];
  long *local_3c0 [2];
  long local_3b0 [14];
  ios_base local_340 [264];
  long local_238 [65];
  
  pcVar1 = (this->file_path_)._M_dataplus._M_p;
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3c0,pcVar1,pcVar1 + (this->file_path_)._M_string_length);
  std::__cxx11::string::append((char *)local_3c0);
  std::ifstream::ifstream(local_238,(string *)local_3c0,_S_in);
  std::istream::operator>>(local_238,&this->brightness_);
  std::ifstream::~ifstream(local_238);
  if (local_3c0[0] != local_3b0) {
    operator_delete(local_3c0[0],local_3b0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->trigger_entries_,
                    (this->trigger_entries_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->trigger_selected_ = 0;
  pcVar1 = (this->file_path_)._M_dataplus._M_p;
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3c0,pcVar1,pcVar1 + (this->file_path_)._M_string_length);
  std::__cxx11::string::append((char *)local_3c0);
  std::ifstream::ifstream(local_238,(string *)local_3c0,_S_in);
  if (local_3c0[0] != local_3b0) {
    operator_delete(local_3c0[0],local_3b0[0] + 1);
  }
  local_418 = 0;
  local_410 = 0;
  local_420 = &local_410;
  cVar2 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_420,cVar2);
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_3c0,(string *)&local_420,_S_out|_S_in);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_3c0,(string *)&local_400,' ');
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    if (*local_400._M_dataplus._M_p == '[') {
      this->trigger_selected_ =
           (int)((ulong)((long)(this->trigger_entries_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->trigger_entries_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->trigger_entries_,&local_400);
  }
  uVar4 = std::__cxx11::string::find((char)&local_420,0x5b);
  uVar5 = std::__cxx11::string::find((char)&local_420,0x5d);
  if (uVar5 == 0xffffffffffffffff || uVar5 <= uVar4) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->trigger_,0,(char *)(this->trigger_)._M_string_length,0x157b43);
  }
  else {
    std::__cxx11::string::substr((ulong)local_3e0,(ulong)&local_420);
    std::__cxx11::string::operator=((string *)&this->trigger_,(string *)local_3e0);
    if (local_3e0[0] != local_3d0) {
      operator_delete(local_3e0[0],local_3d0[0] + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
  std::ios_base::~ios_base(local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,
                    CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                             local_400.field_2._M_local_buf[0]) + 1);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420,CONCAT71(uStack_40f,local_410) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void FetchState() {
    std::ifstream(file_path_ + "/brightness") >> brightness_;
    trigger_entries_.clear();
    trigger_selected_ = 0;

    std::ifstream file(file_path_ + "/trigger");
    std::string trigger;
    std::getline(file, trigger);

    std::string entry;
    std::stringstream ss(trigger);
    while (std::getline(ss, entry, ' ')) {
      if (entry.front() == '[')
        trigger_selected_ = trigger_entries_.size();
      trigger_entries_.push_back(entry);
    }

    size_t left = trigger.find('[');
    size_t right = trigger.find(']');
    if (left < right && left != std::string::npos && right != std::string::npos)
      trigger_ = trigger.substr(left + 1, right - left - 1);
    else
      trigger_ = "error";
  }